

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<double>::Subst_Backward(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double **ppdVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  long local_50;
  long local_48;
  undefined4 extraout_var_00;
  
  lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if ((lVar5 != CONCAT44(extraout_var,iVar4)) ||
     ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<double>::Error
              ("virtual int TPZSkylMatrix<double>::Subst_Backward(TPZFMatrix<TVar> *) const [TVar = double]"
               ,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
  }
  iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(this);
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  if ((lVar5 != 0) && (0 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar11 = lVar5 * 8 + -0x10;
    local_48 = 0;
    local_50 = 0;
    lVar8 = lVar11;
    lVar9 = lVar5;
LAB_00cbcb4d:
    do {
      lVar10 = lVar8;
      if (1 < lVar9) {
        lVar8 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar8 < lVar9) || ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_50))
        {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar12 = *(double *)((long)B->fElem + lVar9 * 8 + lVar8 * local_48 + -8);
        lVar9 = lVar9 + -1;
        if ((dVar12 == 0.0) && (lVar8 = lVar10 + -8, !NAN(dVar12))) goto LAB_00cbcb4d;
        lVar8 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        do {
          ppdVar1 = (this->fElem).fStore;
          pdVar7 = ppdVar1[lVar9];
          pdVar2 = ppdVar1[lVar9 + 1];
          if ((lVar8 <= lVar9) ||
             ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_50)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar6 = B->fElem;
          dVar12 = pdVar6[lVar8 * local_50 + lVar9] / *pdVar7;
          pdVar6[lVar8 * local_50 + lVar9] = dVar12;
          pdVar7 = pdVar7 + 1;
          if (pdVar7 < pdVar2) {
            pdVar6 = (double *)((long)pdVar6 + local_48 * lVar8 + lVar10);
            do {
              *pdVar6 = *pdVar6 - *pdVar7 * dVar12;
              pdVar7 = pdVar7 + 1;
              pdVar6 = pdVar6 + -1;
            } while (pdVar7 < pdVar2);
          }
          lVar10 = lVar10 + -8;
          bVar3 = 1 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar3);
      }
      local_50 = local_50 + 1;
      lVar10 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      local_48 = local_48 + 8;
      lVar8 = lVar11;
      lVar9 = lVar5;
    } while (local_50 < lVar10);
    if (0 < lVar10) {
      lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar11 = 0;
      do {
        if (lVar5 < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar8 = lVar5 * lVar11;
        B->fElem[lVar8] = B->fElem[lVar8] / **(this->fElem).fStore;
        lVar11 = lVar11 + 1;
      } while (lVar11 < lVar10);
    }
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Backward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Backward(B)");
#endif
    int64_t Dimension = this->Dim();
    if(!Dimension) return 1;	// nothing to do
    int64_t j;
    for ( j = 0; j < B->Cols(); j++ )
    {
        int64_t k = Dimension-1;
        while (k>0 && (*B)(k,j) == TVar(0.)) {
            k--;
        }
        //		std::cout << "kstart " << k << std::endl;
        
        for (;k > 0; k-- )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar val;
            TVar *elem_ki = fElem[k];
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            *BPtr /= *elem_ki++;
            val = *BPtr;
            //	BPtr;
            // substract the column of the skyline matrix from the vector.
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            while(elem_ki < end_ki) *--BPtr -= (*elem_ki++) * val;
        }
    }
    for( j = 0; j< B->Cols(); j++) (*B)(0,j) /= fElem[0][0];
    return( 1 );
}